

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cte.cpp
# Opt level: O2

void __thiscall
merlin::cte::joint_marginal
          (cte *this,variable_set *scope,vector<int,_std::allocator<int>_> *evidence)

{
  factor *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  factor *this_02;
  pointer pnVar1;
  long lVar2;
  value vVar3;
  double dVar4;
  bool bVar5;
  pointer pdVar6;
  ostream *poVar7;
  size_t i;
  reference pvVar8;
  cte *this_03;
  ulong uVar9;
  long *plVar10;
  long lVar11;
  long lVar12;
  index_config cv1;
  variable_set v_rem;
  config_index cv2;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  config;
  
  lVar12 = 0xe0;
  uVar9 = 0;
  while( true ) {
    pnVar1 = (this->m_clusters).
             super__Vector_base<merlin::detail::node,_std::allocator<merlin::detail::node>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->m_clusters).
                       super__Vector_base<merlin::detail::node,_std::allocator<merlin::detail::node>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar1) / 0x158) <= uVar9)
    {
      __assert_fail("found",
                    "/workspace/llm4binary/github/license_c_cmakelists/radum2275[P]merlin/src/cte.cpp"
                    ,0x30d,
                    "void merlin::cte::joint_marginal(const variable_set &, std::vector<int> &)");
    }
    variable_set::operator&
              ((variable_set *)&cv1,(variable_set *)((long)pnVar1 + lVar12 + -0xd8),scope);
    bVar5 = variable_set::operator==((variable_set *)&cv1,scope);
    variable_set::~variable_set((variable_set *)&cv1);
    if (bVar5) break;
    uVar9 = uVar9 + 1;
    lVar12 = lVar12 + 0x158;
  }
  factor::factor((factor *)&cv1,scope,0.0);
  this_00 = &this->m_marginal;
  factor::operator=(this_00,(factor *)&cv1);
  factor::~factor((factor *)&cv1);
  pnVar1 = (this->m_clusters).
           super__Vector_base<merlin::detail::node,_std::allocator<merlin::detail::node>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_02 = (factor *)((long)&pnVar1->id + lVar12);
  factor::condition((factor *)&cv1,(factor *)((long)pnVar1 + lVar12 + -0xa0),evidence);
  factor::operator=(this_02,(factor *)&cv1);
  factor::~factor((factor *)&cv1);
  for (plVar10 = *(long **)((long)&(pnVar1->theta).v_.m_dlocal + lVar12);
      plVar10 != *(long **)((long)&(pnVar1->theta).v_.m_dlocal + lVar12 + 8U); plVar10 = plVar10 + 1
      ) {
    lVar11 = *plVar10;
    pdVar6 = this_02[-3].t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((pointer)**(undefined8 **)(lVar11 + 0x40) == pdVar6) {
      factor::binaryOpIP<merlin::factor::binOpTimes>(this_02,lVar11 + 0x48);
      pdVar6 = this_02[-3].t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    if ((pointer)**(undefined8 **)(lVar11 + 0x38) == pdVar6) {
      factor::binaryOpIP<merlin::factor::binOpTimes>(this_02,lVar11 + 0xa8);
    }
  }
  v_rem.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  v_rem.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  v_rem.m_d = (vsize *)0x0;
  v_rem.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  v_rem.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  v_rem.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  v_rem.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (lVar11 = 0; lVar2 = *(long *)((long)pnVar1 + lVar12 + -0xd8),
      lVar11 != *(long *)((long)pnVar1 + lVar12 + -0xd0) - lVar2 >> 3; lVar11 = lVar11 + 1) {
    cv1._0_8_ = *(undefined8 *)(lVar2 + lVar11 * 8);
    cv1.m_dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         *(pointer *)(*(long *)((long)pnVar1 + lVar12 + -0xa8) + lVar11 * 8);
    bVar5 = variable_set::contains(scope,(variable *)&cv1);
    if ((!bVar5) &&
       ((evidence->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[*(long *)(*(long *)((long)pnVar1 + lVar12 + -0xd8) + lVar11 * 8)] < 0)) {
      cv1._0_8_ = *(undefined8 *)(*(long *)((long)pnVar1 + lVar12 + -0xd8) + lVar11 * 8);
      cv1.m_dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           *(pointer *)(*(long *)((long)pnVar1 + lVar12 + -0xa8) + lVar11 * 8);
      variable_set::operator|=(&v_rem,(variable *)&cv1);
    }
  }
  factor::sum((factor *)&cv1,this_02,&v_rem);
  factor::operator=(this_02,(factor *)&cv1);
  factor::~factor((factor *)&cv1);
  if (this->m_debug == true) {
    poVar7 = std::operator<<((ostream *)&std::cout,"[DEBUG] Joint marginal scope: ");
    poVar7 = operator<<(poVar7,&(this->m_marginal).v_);
    std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<((ostream *)&std::cout,"[DEBUG] Actual belief scope:  ");
    poVar7 = operator<<(poVar7,this_02);
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  index_config::index_config(&cv1,&(this->m_marginal).v_,true);
  config_index::config_index
            (&cv2,(variable_set *)
                  ((long)&(pnVar1->clique).m_v.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + lVar12
                  ),true);
  this_01 = &(this->m_marginal).t_;
  for (uVar9 = 0;
      uVar9 < (ulong)((long)(this->m_marginal).t_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(this->m_marginal).t_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3); uVar9 = uVar9 + 1) {
    this_03 = (cte *)&config;
    index_config::convert(&config,&cv1,uVar9);
    bVar5 = is_compatible(this_03,&config,evidence);
    if (bVar5) {
      i = config_index::convert(&cv2,&config);
      vVar3 = factor::get(this_02,i);
      pvVar8 = std::vector<double,_std::allocator<double>_>::at(this_01,uVar9);
      *pvVar8 = vVar3;
    }
    else {
      pvVar8 = std::vector<double,_std::allocator<double>_>::at(this_01,uVar9);
      *pvVar8 = 0.0;
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                 *)&config);
  }
  dVar4 = exp(this->m_logz);
  factor::binaryOpIP<merlin::factor::binOpDivide>(SUB84(dVar4,0),this_00);
  if (this->m_debug == true) {
    poVar7 = std::operator<<((ostream *)&std::cout,"[DEBUG] Joint marginal: ");
    poVar7 = operator<<(poVar7,this_00);
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  config_index::~config_index(&cv2);
  index_config::~index_config(&cv1);
  variable_set::~variable_set(&v_rem);
  return;
}

Assistant:

void cte::joint_marginal(const variable_set& scope, std::vector<int>& evidence) {

	// Get the cluster that contains the scope
	bool found = false;
	size_t j = 0;
	for (size_t i = 0; i < m_clusters.size(); ++i) {
		detail::node& cl = m_clusters[i];
		variable_set temp = (cl.clique & scope);
		if (temp == scope) {
			found = true;
			j = i;
			break;
		}
	}

	// Safety check
	assert(found);

	// Compute the joint marginal (belief) subject to evidence
	m_marginal = factor(scope, 0.0);
	detail::node& n = m_clusters[j];
	n.belief = n.theta.condition(evidence);
	for (std::vector<detail::edge*>::iterator ei = n.edges.begin();
			ei != n.edges.end(); ++ei) {
		detail::edge* e = (*ei);
		if (e->second->id == n.id) {
			n.belief *= e->fwd;
		}
		if (e->first->id == n.id) {
			n.belief *= e->bwd;
		}
	}

	// Update the belief entries subject to evidence
	variable_set v_rem;
	for (variable_set::const_iterator vi = n.clique.begin();
			vi != n.clique.end(); ++vi) {
		if (!scope.contains(*vi) && evidence[vi->label()] < 0) {
			v_rem |= *vi;
		}
	}
	n.belief = n.belief.sum(v_rem);

	if (m_debug) {
		std::cout << "[DEBUG] Joint marginal scope: " << m_marginal.vars() << std::endl;
		std::cout << "[DEBUG] Actual belief scope:  " << n.belief << std::endl;
	}

	// Fill in all configurations of the marginal (including the evidence)
	index_config cv1(m_marginal.vars(), true);
	config_index cv2(n.belief.vars(), true);
	for (size_t i = 0; i < m_marginal.num_states(); ++i) {
		std::map<size_t, size_t> config = cv1.convert(i);
		if (is_compatible(config, evidence)) {
			size_t j = cv2.convert(config);
			double v = n.belief.get(j);
			m_marginal.set(i, v);
		} else {
			m_marginal.set(i, 0.0);
		}
	}

	// Normalize by P(evidence)
	m_marginal /= std::exp(m_logz);

	if (m_debug) {
		std::cout << "[DEBUG] Joint marginal: " << m_marginal << std::endl;
	}
}